

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

Bounds3f * __thiscall
pbrt::BilinearPatch::Bounds(Bounds3f *__return_storage_ptr__,BilinearPatch *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Bounds3<float> BStack_58;
  Bounds3<float> local_40;
  
  lVar3 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar4 = *(long *)(lVar3 + 0x10);
  lVar5 = (long)this->blpIndex * 0x10;
  lVar3 = *(long *)(lVar3 + 0x18);
  iVar1 = *(int *)(lVar4 + 4 + lVar5);
  iVar2 = *(int *)(lVar4 + 0xc + lVar5);
  Bounds3<float>::Bounds3
            (&local_40,(Point3<float> *)((long)*(int *)(lVar4 + lVar5) * 0xc + lVar3),
             (Point3<float> *)((long)*(int *)(lVar4 + 8 + lVar5) * 0xc + lVar3));
  Bounds3<float>::Bounds3
            (&BStack_58,(Point3<float> *)((long)iVar1 * 0xc + lVar3),
             (Point3<float> *)((long)iVar2 * 0xc + lVar3));
  Union<float>(__return_storage_ptr__,&local_40,&BStack_58);
  return __return_storage_ptr__;
}

Assistant:

Bounds3f BilinearPatch::Bounds() const {
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    return Union(Bounds3f(p00, p01), Bounds3f(p10, p11));
}